

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pngwrite.c
# Opt level: O2

void png_set_text_compression_method(png_structrp png_ptr,int method)

{
  if (png_ptr != (png_structrp)0x0) {
    if (method != 8) {
      png_warning(png_ptr,"Only compression method 8 is supported by PNG");
    }
    png_ptr->zlib_text_method = method;
  }
  return;
}

Assistant:

void PNGAPI
png_set_text_compression_method(png_structrp png_ptr, int method)
{
   png_debug(1, "in png_set_text_compression_method");

   if (png_ptr == NULL)
      return;

   if (method != 8)
      png_warning(png_ptr, "Only compression method 8 is supported by PNG");

   png_ptr->zlib_text_method = method;
}